

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePresetsGraphReadJSON.cxx
# Opt level: O3

bool cmCMakePresetsGraphInternal::PresetVectorIntHelper
               (vector<int,_std::allocator<int>_> *out,Value *value,cmJSONState *state)

{
  bool bVar1;
  int iVar2;
  cmJSONState *local_48;
  Value *local_40;
  code *local_38;
  undefined8 local_30;
  code *local_28;
  code *local_20;
  
  if (PresetVectorIntHelper(std::vector<int,std::allocator<int>>&,Json::Value_const*,cmJSONState*)::
      helper == '\0') {
    iVar2 = __cxa_guard_acquire(&PresetVectorIntHelper(std::vector<int,std::allocator<int>>&,Json::Value_const*,cmJSONState*)
                                 ::helper);
    if (iVar2 != 0) {
      local_30 = 0;
      local_38 = cmCMakePresetsErrors::INVALID_PRESET;
      local_20 = std::
                 _Function_handler<void_(const_Json::Value_*,_cmJSONState_*),_void_(*)(const_Json::Value_*,_cmJSONState_*)>
                 ::_M_invoke;
      local_28 = std::
                 _Function_handler<void_(const_Json::Value_*,_cmJSONState_*),_void_(*)(const_Json::Value_*,_cmJSONState_*)>
                 ::_M_manager;
      cmJSONHelperBuilder::
      VectorFilter<int,bool(*)(int&,Json::Value_const*,cmJSONState*),cmJSONHelperBuilder::Vector<int,bool(*)(int&,Json::Value_const*,cmJSONState*)>(std::function<void(Json::Value_const*,cmJSONState*)>,bool(*)(int&,Json::Value_const*,cmJSONState*))::_lambda(int_const&)_1_>
                (&PresetVectorIntHelper::helper,(cmJSONHelperBuilder *)&local_38,PresetIntHelper);
      if (local_28 != (code *)0x0) {
        (*local_28)(&local_38,&local_38,3);
      }
      __cxa_atexit(std::_Function_base::~_Function_base,&PresetVectorIntHelper::helper,&__dso_handle
                  );
      __cxa_guard_release(&PresetVectorIntHelper(std::vector<int,std::allocator<int>>&,Json::Value_const*,cmJSONState*)
                           ::helper);
    }
  }
  local_48 = state;
  local_40 = value;
  if (PresetVectorIntHelper::helper.super__Function_base._M_manager != (_Manager_type)0x0) {
    bVar1 = (*PresetVectorIntHelper::helper._M_invoker)
                      ((_Any_data *)&PresetVectorIntHelper::helper,out,&local_40,&local_48);
    return bVar1;
  }
  std::__throw_bad_function_call();
}

Assistant:

bool PresetVectorIntHelper(std::vector<int>& out, const Json::Value* value,
                           cmJSONState* state)
{
  static auto const helper = JSONHelperBuilder::Vector<int>(
    cmCMakePresetsErrors::INVALID_PRESET, PresetIntHelper);
  return helper(out, value, state);
}